

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(ze_device_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream ss;
  ze_structure_type_t in_stack_00000008;
  ze_device_type_t in_stack_00000018;
  uint in_stack_0000001c;
  uint in_stack_00000020;
  ze_device_property_flag_t in_stack_00000024;
  uint in_stack_00000028;
  uint in_stack_0000002c;
  unsigned_long in_stack_00000030;
  uint in_stack_00000038;
  uint in_stack_0000003c;
  uint in_stack_00000040;
  uint in_stack_00000044;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  uint in_stack_00000050;
  unsigned_long in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  string asStackY_1b8 [16];
  ostream local_1a8 [8];
  ze_device_uuid_t in_stack_fffffffffffffe60;
  string local_30 [32];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)asStackY_1b8,in_stack_00000008);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)asStackY_1b8);
  poVar1 = std::operator<<(local_1a8,"0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::stringstream::~stringstream((stringstream *)asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)asStackY_1b8,in_stack_00000018);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_0000001c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000020);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)asStackY_1b8,in_stack_00000024);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000028);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_0000002c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000030);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000038);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_0000003c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000040);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000044);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000048);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_0000004c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000050);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000058);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000060);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)asStackY_1b8,in_stack_00000064);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_(in_stack_fffffffffffffe60);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStackY_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string(const ze_device_properties_t val)
{
    std::string str;
    
    str += "Device::properties_t::stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "Device::properties_t::pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "Device::properties_t::type : ";
    str += to_string(val.type);
    str += "\n";
    
    str += "Device::properties_t::vendorId : ";
    str += std::to_string(val.vendorId);
    str += "\n";
    
    str += "Device::properties_t::deviceId : ";
    str += std::to_string(val.deviceId);
    str += "\n";
    
    str += "Device::properties_t::flags : ";
    str += to_string((ze_device_property_flag_t)val.flags);
    str += "\n";
    
    str += "Device::properties_t::subdeviceId : ";
    str += std::to_string(val.subdeviceId);
    str += "\n";
    
    str += "Device::properties_t::coreClockRate : ";
    str += std::to_string(val.coreClockRate);
    str += "\n";
    
    str += "Device::properties_t::maxMemAllocSize : ";
    str += std::to_string(val.maxMemAllocSize);
    str += "\n";
    
    str += "Device::properties_t::maxHardwareContexts : ";
    str += std::to_string(val.maxHardwareContexts);
    str += "\n";
    
    str += "Device::properties_t::maxCommandQueuePriority : ";
    str += std::to_string(val.maxCommandQueuePriority);
    str += "\n";
    
    str += "Device::properties_t::numThreadsPerEU : ";
    str += std::to_string(val.numThreadsPerEU);
    str += "\n";
    
    str += "Device::properties_t::physicalEUSimdWidth : ";
    str += std::to_string(val.physicalEUSimdWidth);
    str += "\n";
    
    str += "Device::properties_t::numEUsPerSubslice : ";
    str += std::to_string(val.numEUsPerSubslice);
    str += "\n";
    
    str += "Device::properties_t::numSubslicesPerSlice : ";
    str += std::to_string(val.numSubslicesPerSlice);
    str += "\n";
    
    str += "Device::properties_t::numSlices : ";
    str += std::to_string(val.numSlices);
    str += "\n";
    
    str += "Device::properties_t::timerResolution : ";
    str += std::to_string(val.timerResolution);
    str += "\n";
    
    str += "Device::properties_t::timestampValidBits : ";
    str += std::to_string(val.timestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::kernelTimestampValidBits : ";
    str += std::to_string(val.kernelTimestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::uuid : ";
    str += to_string(val.uuid);
    str += "\n";
    
    str += "Device::properties_t::name : ";
    str += val.name;
    str += "\n";

    return str;
}